

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_2::SamplePosDistributionCase::init
          (SamplePosDistributionCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  int iVar2;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  if ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_renderTarget ==
      TARGET_TEXTURE) {
    local_190._0_8_ =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying gl_SamplePosition value:\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "\t1) With non-multisample targets: Expect the center of the pixel.\n",0x42);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\t2) With multisample targets:\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\t\ta) Expect legal sample position.\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "\t\tb) Sample position is unique within the set of all sample positions of a pixel.\n"
               ,0x52);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "\t\tc) Sample position distribution is uniform or almost uniform.\n",0x40);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_190._0_8_ =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying gl_SamplePosition value:\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "\t1) With non-multisample targets: Expect the center of the pixel.\n",0x42);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\t2) With multisample targets:\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\t\ta) Expect legal sample position.\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "\t\tb) Sample position distribution is uniform or almost uniform.\n",0x40);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  ctx_00 = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_190 + 8));
  std::ios_base::~ios_base(local_118);
  iVar2 = MultisampleRenderCase::init(&this->super_MultisampleRenderCase,ctx_00);
  return iVar2;
}

Assistant:

void SamplePosDistributionCase::init (void)
{
	// log the test method and expectations
	if (m_renderTarget == TARGET_TEXTURE)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying gl_SamplePosition value:\n"
			<< "	1) With non-multisample targets: Expect the center of the pixel.\n"
			<< "	2) With multisample targets:\n"
			<< "		a) Expect legal sample position.\n"
			<< "		b) Sample position is unique within the set of all sample positions of a pixel.\n"
			<< "		c) Sample position distribution is uniform or almost uniform.\n"
			<< tcu::TestLog::EndMessage;
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying gl_SamplePosition value:\n"
			<< "	1) With non-multisample targets: Expect the center of the pixel.\n"
			<< "	2) With multisample targets:\n"
			<< "		a) Expect legal sample position.\n"
			<< "		b) Sample position distribution is uniform or almost uniform.\n"
			<< tcu::TestLog::EndMessage;
	}

	MultisampleRenderCase::init();
}